

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdom.cpp
# Opt level: O2

void __thiscall QDomNodePrivate::normalize(QDomNodePrivate *this)

{
  int iVar1;
  QDomNodePrivate *tmp;
  QDomNodePrivate *pQVar2;
  QDomNodePrivate *pQVar3;
  QDomNodePrivate *pQVar4;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_50;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = this->first;
  pQVar3 = (QDomNodePrivate *)0x0;
LAB_0010e013:
  do {
    pQVar4 = pQVar3;
    pQVar3 = pQVar2;
    while( true ) {
      if (pQVar3 == (QDomNodePrivate *)0x0) {
        if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
          __stack_chk_fail();
        }
        return;
      }
      iVar1 = (*pQVar3->_vptr_QDomNodePrivate[0xb])(pQVar3);
      if (1 < iVar1 - 3U) break;
      pQVar2 = pQVar3->next;
      if (pQVar4 == (QDomNodePrivate *)0x0) goto LAB_0010e013;
      local_50.d = (pQVar3->value).d.d;
      local_50.ptr = (pQVar3->value).d.ptr;
      local_50.size = (pQVar3->value).d.size;
      if (local_50.d != (Data *)0x0) {
        LOCK();
        ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_50.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      QString::append(&pQVar4->value);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_50);
      (*this->_vptr_QDomNodePrivate[6])(this,pQVar3);
      pQVar3 = pQVar2;
    }
    pQVar2 = pQVar3->next;
    pQVar3 = (QDomNodePrivate *)0x0;
  } while( true );
}

Assistant:

void QDomNodePrivate::normalize()
{
    // ### This one has moved from QDomElementPrivate to this position. It is
    // not tested.
    qNormalizeNode(this);
}